

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Minisat::BoolOption::parse(BoolOption *this,char *str)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  bool b;
  char *span;
  char *local_20 [4];
  
  local_20[0] = in_RSI;
  bVar1 = match<char_const*>(local_20,"-");
  if (bVar1) {
    bVar1 = match<char_const*>(local_20,"no-");
    iVar2 = strcmp(local_20[0],*(char **)(in_RDI + 8));
    if (iVar2 == 0) {
      *(byte *)(in_RDI + 0x30) = (bVar1 ^ 0xffU) & 1;
      return true;
    }
  }
  return false;
}

Assistant:

virtual bool parse(const char *str)
    {
        const char *span = str;

        if (match(span, "-")) {
            bool b = !match(span, "no-");

            if (strcmp(span, name) == 0) {
                value = b;
                return true;
            }
        }

        return false;
    }